

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

QRgbaFloat32 *
fetchTransformedFP<(TextureBlendType)3>
          (QRgbaFloat32 *buffer,Operator *param_2,QSpanData *data,int y,int x,int length)

{
  uchar *puVar1;
  undefined8 *puVar2;
  uchar *puVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  BPP BVar7;
  uint uVar8;
  double dVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  QRgbaFloat32 *pQVar18;
  long in_FS_OFFSET;
  int iVar19;
  int iVar20;
  double dVar21;
  int iVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  uint buffer32 [2048];
  unsigned_long_long local_4038 [2049];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  BVar7 = qPixelLayouts[(data->field_23).texture.format].bpp;
  if ((int)BVar7 < 7) {
    if (BVar7 == BPP32) {
      fetchTransformed_fetcher<(TextureBlendType)3,(QPixelLayout::BPP)6,unsigned_int>
                ((uint *)local_4038,data,y,x,length);
    }
    else {
      fetchTransformed_fetcher<(TextureBlendType)3,(QPixelLayout::BPP)0,unsigned_int>
                ((uint *)local_4038,data,y,x,length);
    }
    (*qConvertToRGBA32F[(data->field_23).texture.format])
              (buffer,(uint *)local_4038,length,(data->field_23).texture.colorTable,
               (QDitherInfo *)0x0);
  }
  else if (BVar7 < BPP32FPx4) {
    fetchTransformed_fetcher<(TextureBlendType)3,(QPixelLayout::BPP)7,unsigned_long_long>
              (local_4038,data,y,x,length);
    (*convert64ToRGBA32F[(data->field_23).texture.format])(buffer,local_4038,length);
  }
  else {
    dVar25 = (double)x + 0.5;
    dVar21 = (double)y + 0.5;
    bVar12 = canUseFastMatrixPath(dVar25,dVar21,(long)length,data);
    dVar4 = data->m11;
    if (bVar12) {
      iVar19 = (int)(data->m12 * 65536.0);
      iVar20 = (int)((data->dx + data->m21 * dVar21 + dVar25 * dVar4) * 65536.0);
      iVar22 = (int)((data->dy + data->m22 * dVar21 + dVar25 * data->m12) * 65536.0);
      if (iVar19 == 0) {
        iVar22 = iVar22 >> 0x10;
        uVar8 = (data->field_23).texture.height;
        if (iVar22 < 0 || (int)uVar8 <= iVar22) {
          iVar22 = (iVar22 % (int)uVar8 >> 0x1f & uVar8) + iVar22 % (int)uVar8;
        }
        lVar15 = (data->field_23).texture.bytesPerLine;
        puVar1 = (data->field_23).texture.imageData;
        lVar16 = 0;
        uVar17 = 0;
        if (0 < length) {
          uVar17 = (ulong)(uint)length;
        }
        for (; uVar17 * 0x10 != lVar16; lVar16 = lVar16 + 0x10) {
          iVar19 = iVar20 >> 0x10;
          uVar8 = (data->field_23).texture.width;
          if (iVar19 < 0 || (int)uVar8 <= iVar19) {
            iVar19 = (iVar19 % (int)uVar8 >> 0x1f & uVar8) + iVar19 % (int)uVar8;
          }
          puVar3 = puVar1 + (long)iVar19 * 0x10 + iVar22 * lVar15;
          uVar10 = *(undefined8 *)(puVar3 + 8);
          puVar2 = (undefined8 *)((long)&buffer->r + lVar16);
          *puVar2 = *(undefined8 *)puVar3;
          puVar2[1] = uVar10;
          iVar20 = iVar20 + (int)(dVar4 * 65536.0);
        }
      }
      else {
        lVar15 = 0;
        uVar17 = 0;
        if (0 < length) {
          uVar17 = (ulong)(uint)length;
        }
        for (; uVar17 * 0x10 != lVar15; lVar15 = lVar15 + 0x10) {
          iVar14 = iVar20 >> 0x10;
          uVar8 = (data->field_23).texture.width;
          if (iVar14 < 0 || (int)uVar8 <= iVar14) {
            iVar14 = (iVar14 % (int)uVar8 >> 0x1f & uVar8) + iVar14 % (int)uVar8;
          }
          iVar13 = iVar22 >> 0x10;
          uVar8 = (data->field_23).texture.height;
          if (iVar13 < 0 || (int)uVar8 <= iVar13) {
            iVar13 = (iVar13 % (int)uVar8 >> 0x1f & uVar8) + iVar13 % (int)uVar8;
          }
          puVar1 = (data->field_23).texture.imageData +
                   (long)iVar14 * 0x10 + (long)iVar13 * (data->field_23).texture.bytesPerLine;
          uVar10 = *(undefined8 *)(puVar1 + 8);
          puVar2 = (undefined8 *)((long)&buffer->r + lVar15);
          *puVar2 = *(undefined8 *)puVar1;
          puVar2[1] = uVar10;
          iVar20 = iVar20 + (int)(dVar4 * 65536.0);
          iVar22 = iVar22 + iVar19;
        }
      }
    }
    else {
      dVar5 = data->m13;
      dVar6 = data->m12;
      dVar23 = data->dx + dVar21 * data->m21 + dVar25 * dVar4;
      dVar24 = data->dy + dVar21 * data->m22 + dVar25 * dVar6;
      dVar25 = dVar21 * data->m23 + dVar25 * dVar5 + data->m33;
      for (pQVar18 = buffer; pQVar18 < buffer + length; pQVar18 = pQVar18 + 1) {
        dVar9 = (double)(-(ulong)(dVar25 == 0.0) & 0x3ff0000000000000 |
                        ~-(ulong)(dVar25 == 0.0) & (ulong)(1.0 / dVar25));
        dVar21 = floor(dVar23 * dVar9);
        dVar9 = floor(dVar24 * dVar9);
        iVar22 = (int)dVar9;
        uVar8 = (data->field_23).texture.height;
        if (iVar22 < 0 || (int)uVar8 <= iVar22) {
          iVar22 = (iVar22 % (int)uVar8 >> 0x1f & uVar8) + iVar22 % (int)uVar8;
        }
        iVar20 = (int)dVar21;
        uVar8 = (data->field_23).texture.width;
        if (iVar20 < 0 || (int)uVar8 <= iVar20) {
          iVar20 = (iVar20 % (int)uVar8 >> 0x1f & uVar8) + iVar20 % (int)uVar8;
        }
        puVar1 = (data->field_23).texture.imageData +
                 (long)iVar20 * 0x10 + (long)iVar22 * (data->field_23).texture.bytesPerLine;
        uVar10 = *(undefined8 *)puVar1;
        uVar11 = *(undefined8 *)(puVar1 + 8);
        pQVar18->r = (float)(int)uVar10;
        pQVar18->g = (float)(int)((ulong)uVar10 >> 0x20);
        pQVar18->b = (float)(int)uVar11;
        pQVar18->a = (float)(int)((ulong)uVar11 >> 0x20);
        dVar23 = dVar23 + dVar4;
        dVar24 = dVar24 + dVar6;
        dVar25 = dVar25 + dVar5;
        dVar25 = (double)((ulong)dVar25 & -(ulong)(dVar25 != 0.0) |
                         ~-(ulong)(dVar25 != 0.0) & (ulong)(dVar5 + dVar25));
      }
    }
    if ((data->field_23).texture.format == Format_RGBA32FPx4) {
      convertRGBA32FToRGBA32FPM(buffer,length);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return buffer;
  }
  __stack_chk_fail();
}

Assistant:

static const QRgbaFloat32 *QT_FASTCALL fetchTransformedFP(QRgbaFloat32 *buffer, const Operator *, const QSpanData *data,
                                                      int y, int x, int length)
{
    const QPixelLayout *layout = &qPixelLayouts[data->texture.format];
    if (layout->bpp < QPixelLayout::BPP64) {
        Q_DECL_UNINITIALIZED uint buffer32[BufferSize];
        Q_ASSERT(length <= BufferSize);
        if (layout->bpp == QPixelLayout::BPP32)
            fetchTransformed_fetcher<blendType, QPixelLayout::BPP32, uint>(buffer32, data, y, x, length);
        else
            fetchTransformed_fetcher<blendType, QPixelLayout::BPPNone, uint>(buffer32, data, y, x, length);
        qConvertToRGBA32F[data->texture.format](buffer, buffer32, length, data->texture.colorTable, nullptr);
    } else if (layout->bpp < QPixelLayout::BPP32FPx4) {
        Q_DECL_UNINITIALIZED quint64 buffer64[BufferSize];
        fetchTransformed_fetcher<blendType, QPixelLayout::BPP64, quint64>(buffer64, data, y, x, length);
        convert64ToRGBA32F[data->texture.format](buffer, buffer64, length);
    } else {
        fetchTransformed_fetcher<blendType, QPixelLayout::BPP32FPx4, QRgbaFloat32>(buffer, data, y, x, length);
        if (data->texture.format == QImage::Format_RGBA32FPx4)
            convertRGBA32FToRGBA32FPM(buffer, length);
        return buffer;
    }
    return buffer;
}